

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libdivide.h
# Opt level: O1

long __thiscall
libdivide::divider<long,_(libdivide::Branching)0>::recover
          (divider<long,_(libdivide::Branching)0> *this)

{
  byte bVar1;
  long lVar2;
  uint8_t more;
  long lVar3;
  
  bVar1 = (this->div).denom.more;
  if ((this->div).denom.magic == 0) {
    lVar3 = 1L << (bVar1 & 0x3f);
    lVar2 = -lVar3;
  }
  else {
    lVar3 = 1;
    lVar2 = -1;
  }
  if (-1 < (char)bVar1) {
    lVar2 = lVar3;
  }
  return lVar2;
}

Assistant:

T recover() const { return div.recover(); }